

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::reset(Synth *this)

{
  long lVar1;
  
  if (this->opened == true) {
    (*this->reportHandler->_vptr_ReportHandler[9])();
    PartialManager::deactivateAll(this->partialManager);
    memcpy(this->mt32ram,this->mt32default,0x10dab);
    for (lVar1 = 0x2030; lVar1 != 0x2039; lVar1 = lVar1 + 1) {
      Part::reset(*(Part **)(this->controlROMData + lVar1 * 8 + -0x60));
      if (lVar1 == 0x2038) {
        (*this->parts[8]->_vptr_Part[6])();
      }
      else {
        (**(code **)(**(long **)(this->controlROMData + lVar1 * 8 + -0x60) + 0x28))
                  (*(long **)(this->controlROMData + lVar1 * 8 + -0x60),
                   *(undefined1 *)
                    ((long)this + lVar1 + -0x1fd0 + (ulong)this->controlROMMap->programSettings));
      }
    }
    refreshSystem(this);
    this->extensions->masterTunePitchDelta = 0;
    isActive(this);
    return;
  }
  return;
}

Assistant:

void Synth::reset() {
	if (!opened) return;
#if MT32EMU_MONITOR_SYSEX > 0
	printDebug("RESET");
#endif
	reportHandler->onDeviceReset();
	partialManager->deactivateAll();
	mt32ram = mt32default;
	for (int i = 0; i < 9; i++) {
		parts[i]->reset();
		if (i != 8) {
			parts[i]->setProgram(controlROMData[controlROMMap->programSettings + i]);
		} else {
			parts[8]->refresh();
		}
	}
	refreshSystem();
	resetMasterTunePitchDelta();
	isActive();
}